

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt1Bool32x4_1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  OpCode opcode_00;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar3;
  Instr *instr_00;
  Instr *instr;
  OpCode opcode;
  RegOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TySimd128B4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,valueType);
  opcode_00 = GetSimdOpcode(this,newOpcode);
  if ((opcode_00 != Simd128_AllTrue_B4) && (opcode_00 != Simd128_AnyTrue_B4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x181e,
                       "((opcode == Js::OpCode::Simd128_AllTrue_B4 || opcode == Js::OpCode::Simd128_AnyTrue_B4))"
                       ,"Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  instr_00 = IR::Instr::New(opcode_00,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Bool32x4_1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG2)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128B4);
    src1Opnd->SetValueType(ValueType::Simd);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    Js::OpCode opcode = GetSimdOpcode(newOpcode);

    AssertMsg((opcode == Js::OpCode::Simd128_AllTrue_B4 || opcode == Js::OpCode::Simd128_AnyTrue_B4),
        "Unexpected opcode for this format.");

    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, m_func);
    AddInstr(instr, offset);
}